

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# annotator.cpp
# Opt level: O0

void __thiscall
Annotator_clearAllIdsNoModelPresent_Test::~Annotator_clearAllIdsNoModelPresent_Test
          (Annotator_clearAllIdsNoModelPresent_Test *this)

{
  Annotator_clearAllIdsNoModelPresent_Test *this_local;
  
  ~Annotator_clearAllIdsNoModelPresent_Test(this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(Annotator, clearAllIdsNoModelPresent)
{
    std::vector<std::string> expectedErrors = {
        "This Annotator object does not have a model to work with.",
    };

    auto annotator = libcellml::Annotator::create();

    annotator->clearAllIds();
    EXPECT_EQ(size_t(1), annotator->errorCount());
    EXPECT_EQ(expectedErrors[0], annotator->error(0)->description());
}